

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRAccessChain * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::
allocate<unsigned_int_const&,spv::StorageClass_const&,std::__cxx11::string&,std::__cxx11::string&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRAccessChain> *this,uint *p,StorageClass *p_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_3,uint *p_4)

{
  uint uVar1;
  StorageClass storage_;
  SPIRAccessChain *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRAccessChain **ppSVar4;
  string local_b0;
  string local_90;
  TypeID local_6c;
  SPIRAccessChain *local_68;
  SPIRAccessChain *ptr;
  uint local_54;
  SPIRAccessChain *pSStack_50;
  uint i;
  SPIRAccessChain *ptr_1;
  uint *puStack_40;
  uint num_objects;
  uint *p_local_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_local_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_local_2;
  StorageClass *p_local_1;
  uint *p_local;
  ObjectPool<spirv_cross::SPIRAccessChain> *this_local;
  
  puStack_40 = p_4;
  p_local_4 = (uint *)p_3;
  p_local_3 = p_2;
  p_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_1;
  p_local_1 = p;
  p_local = (uint *)this;
  bVar2 = VectorView<spirv_cross::SPIRAccessChain_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_50 = (SPIRAccessChain *)malloc((ulong)ptr_1._4_4_ * 0xa8);
    if (pSStack_50 == (SPIRAccessChain *)0x0) {
      return (SPIRAccessChain *)0x0;
    }
    SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::reserve(&this->vacants,(ulong)ptr_1._4_4_);
    for (local_54 = 0; local_54 < ptr_1._4_4_; local_54 = local_54 + 1) {
      ptr = pSStack_50 + local_54;
      SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRAccessChain,spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRAccessChain*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRAccessChain,spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffb0);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRAccessChain_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>);
  local_68 = *ppSVar4;
  SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_68;
  TypedID<(spirv_cross::Types)1>::TypedID(&local_6c,*p_local_1);
  storage_ = *(StorageClass *)p_local_2;
  ::std::__cxx11::string::string((string *)&local_90,(string *)p_local_3);
  ::std::__cxx11::string::string((string *)&local_b0,(string *)p_local_4);
  SPIRAccessChain::SPIRAccessChain(this_00,local_6c,storage_,&local_90,&local_b0,*puStack_40);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_90);
  return local_68;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}